

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

string * __thiscall
r_comp::Compiler::getError_abi_cxx11_(string *__return_storage_ptr__,Compiler *this)

{
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_70,&this->m_errorFile,":");
  std::__cxx11::to_string(&local_90,this->m_errorLine);
  std::operator+(&local_50,&local_70,&local_90);
  std::operator+(&local_30,&local_50,": ");
  std::operator+(__return_storage_ptr__,&local_30,&this->error);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string Compiler::getError()
{
    return m_errorFile + ":" + std::to_string(m_errorLine) + ": " + error;
}